

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuPair.c
# Opt level: O0

Fxu_Pair * Fxu_PairAlloc(Fxu_Matrix *p,Fxu_Cube *pCube1,Fxu_Cube *pCube2)

{
  Fxu_Pair *__s;
  Fxu_Pair *pPair;
  Fxu_Cube *pCube2_local;
  Fxu_Cube *pCube1_local;
  Fxu_Matrix *p_local;
  
  if (pCube1->pVar == pCube2->pVar) {
    __s = (Fxu_Pair *)Fxu_MemFetch(p,0x40);
    memset(__s,0,0x40);
    __s->pCube1 = pCube1;
    __s->pCube2 = pCube2;
    __s->iCube1 = pCube1->iCube;
    __s->iCube2 = pCube2->iCube;
    return __s;
  }
  __assert_fail("pCube1->pVar == pCube2->pVar",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuPair.c"
                ,0x20a,"Fxu_Pair *Fxu_PairAlloc(Fxu_Matrix *, Fxu_Cube *, Fxu_Cube *)");
}

Assistant:

Fxu_Pair * Fxu_PairAlloc( Fxu_Matrix * p, Fxu_Cube * pCube1, Fxu_Cube * pCube2 )
{
    Fxu_Pair * pPair;
   	assert( pCube1->pVar == pCube2->pVar );
	pPair = MEM_ALLOC_FXU( p, Fxu_Pair, 1 );
	memset( pPair, 0, sizeof(Fxu_Pair) );
	pPair->pCube1 = pCube1;
	pPair->pCube2 = pCube2;
	pPair->iCube1 = pCube1->iCube;
	pPair->iCube2 = pCube2->iCube;
    return pPair;
}